

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

iterator divsufsortxx::helper::
         median3<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                   (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator v1,
                   iterator v2,iterator v3)

{
  value_type vVar1;
  value_type vVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  pos_type pVar4;
  BitmapArray<long> *pBVar5;
  pos_type pVar6;
  BitmapArray<long> *pBVar7;
  pos_type pVar8;
  BitmapArray<long> *pBVar9;
  iterator iVar10;
  BitmapArray<long> *local_50;
  pos_type local_48;
  
  local_48 = v1.pos_;
  local_50 = v1.array_;
  pVar8 = v3.pos_;
  pBVar7 = v3.array_;
  pVar4 = v2.pos_;
  pBVar5 = v2.array_;
  iVar3 = (*(local_50->super_Bitmap)._vptr_Bitmap[5])();
  vVar1 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (&Td,CONCAT44(extraout_var,iVar3));
  iVar3 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar4);
  vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (&Td,CONCAT44(extraout_var_00,iVar3));
  pVar6 = pVar4;
  pBVar9 = pBVar5;
  if (vVar2 < vVar1) {
    pVar6 = local_48;
    pBVar9 = local_50;
    local_50 = pBVar5;
    local_48 = pVar4;
  }
  iVar3 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,pVar6);
  vVar1 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (&Td,CONCAT44(extraout_var_01,iVar3));
  iVar3 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,pVar8);
  vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (&Td,CONCAT44(extraout_var_02,iVar3));
  if (vVar2 < vVar1) {
    iVar3 = (*(local_50->super_Bitmap)._vptr_Bitmap[5])(local_50,local_48);
    vVar1 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                      (&Td,CONCAT44(extraout_var_03,iVar3));
    iVar3 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,pVar8);
    vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                      (&Td,CONCAT44(extraout_var_04,iVar3));
    pVar6 = pVar8;
    pBVar9 = pBVar7;
    if (vVar2 < vVar1) {
      pVar6 = local_48;
      pBVar9 = local_50;
    }
  }
  iVar10.pos_ = pVar6;
  iVar10.array_ = pBVar9;
  return iVar10;
}

Assistant:

SAIterator_type median3(const StringIterator_type Td, SAIterator_type v1,
                        SAIterator_type v2, SAIterator_type v3) {
  if (Td[*v1] > Td[*v2]) {
    std::swap(v1, v2);
  }
  if (Td[*v2] > Td[*v3]) {
    if (Td[*v1] > Td[*v3]) {
      return v1;
    } else {
      return v3;
    }
  }
  return v2;
}